

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.cc
# Opt level: O0

void lf::base::PrintInfo(ostream *stream,RefEl *ref_el,int output_ctrl)

{
  RefElType RVar1;
  RefElType RVar2;
  ostream *poVar3;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar4;
  CoeffReturnType CVar5;
  bool local_161;
  ConstColXpr local_120;
  ConstColXpr local_e8;
  RefEl local_ab;
  RefEl local_aa;
  RefEl local_a9;
  string local_a8;
  int local_88;
  RefEl local_81;
  int32_t sub_ent;
  size_type local_5c;
  dim_t local_58;
  dim_t num_sub_ent;
  dim_t co_dim;
  string local_48;
  size_type local_24;
  dim_t local_20;
  dim_t no_nodes;
  dim_t dim_ref_el;
  int output_ctrl_local;
  RefEl *ref_el_local;
  ostream *stream_local;
  
  no_nodes = output_ctrl;
  _dim_ref_el = ref_el;
  ref_el_local = (RefEl *)stream;
  local_20 = RefEl::Dimension(ref_el);
  local_24 = RefEl::NumNodes(_dim_ref_el);
  poVar3 = std::operator<<((ostream *)ref_el_local,"Type of reference element: ");
  RefEl::ToString_abi_cxx11_(&local_48,_dim_ref_el);
  poVar3 = std::operator<<(poVar3,(string *)&local_48);
  std::operator<<(poVar3,'\n');
  std::__cxx11::string::~string((string *)&local_48);
  poVar3 = std::operator<<((ostream *)ref_el_local,"Dimension: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)ref_el_local,"Number of nodes: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24);
  std::operator<<(poVar3,'\n');
  if (0 < (int)no_nodes) {
    for (local_58 = local_20; local_58 != 0; local_58 = local_58 - 1) {
      local_5c = RefEl::NumSubEntities(_dim_ref_el,local_58);
      poVar3 = std::operator<<((ostream *)ref_el_local,"Codimension ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_58);
      poVar3 = std::operator<<(poVar3," has ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_5c);
      poVar3 = std::operator<<(poVar3," entities of type ");
      local_81 = RefEl::SubType(_dim_ref_el,local_58,0);
      RefEl::ToString_abi_cxx11_((string *)&sub_ent,&local_81);
      poVar3 = std::operator<<(poVar3,(string *)&sub_ent);
      std::operator<<(poVar3,'\n');
      std::__cxx11::string::~string((string *)&sub_ent);
      if (10 < (int)no_nodes) {
        for (; local_5c != 0; local_5c = local_5c - 1) {
          local_88 = local_5c - 1;
          poVar3 = std::operator<<((ostream *)ref_el_local," Subentity ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_88);
          poVar3 = std::operator<<(poVar3," is of type ");
          local_a9 = RefEl::SubType(_dim_ref_el,local_58,0);
          RefEl::ToString_abi_cxx11_(&local_a8,&local_a9);
          std::operator<<(poVar3,(string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          local_aa = RefEl::SubType(_dim_ref_el,local_58,0);
          RVar1 = RefEl::operator_cast_to_RefElType(&local_aa);
          local_ab = RefEl::kPoint();
          RVar2 = RefEl::operator_cast_to_RefElType(&local_ab);
          local_161 = RVar1 == RVar2 && 0x14 < (int)no_nodes;
          if (local_161) {
            poVar3 = std::operator<<((ostream *)ref_el_local," and has coordinates [");
            pDVar4 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     RefEl::NodeCoords(_dim_ref_el);
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                      (&local_e8,pDVar4,(long)local_88);
            CVar5 = Eigen::
                    DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  *)&local_e8,0);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,CVar5);
            poVar3 = std::operator<<(poVar3," ");
            pDVar4 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     RefEl::NodeCoords(_dim_ref_el);
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                      (&local_120,pDVar4,(long)local_88);
            CVar5 = Eigen::
                    DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  *)&local_120,1);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,CVar5);
            poVar3 = std::operator<<(poVar3,"]");
            std::operator<<(poVar3,'\n');
          }
          std::operator<<((ostream *)ref_el_local,'\n');
        }
      }
    }
  }
  return;
}

Assistant:

void PrintInfo(std::ostream &stream, const RefEl &ref_el, int output_ctrl) {
  const base::dim_t dim_ref_el = ref_el.Dimension();
  const base::dim_t no_nodes = ref_el.NumNodes();
  stream << "Type of reference element: " << ref_el.ToString() << '\n';
  stream << "Dimension: " << dim_ref_el << '\n';
  stream << "Number of nodes: " << no_nodes << '\n';

  if (output_ctrl > 0) {
    // Loop over dimensions
    for (base::dim_t co_dim = dim_ref_el; co_dim > 0; co_dim--) {
      base::dim_t num_sub_ent = ref_el.NumSubEntities(co_dim);
      stream << "Codimension " << co_dim << " has " << num_sub_ent
             << " entities of type " << ref_el.SubType(co_dim, 0).ToString()
             << '\n';

      if (output_ctrl > 10) {
        for (; num_sub_ent > 0; num_sub_ent--) {
          const std::int32_t sub_ent =
              static_cast<std::int32_t>(num_sub_ent) - 1;
          stream << " Subentity " << sub_ent << " is of type "
                 << ref_el.SubType(co_dim, 0).ToString();

          if (ref_el.SubType(co_dim, 0) == RefEl::kPoint() &&
              output_ctrl > 20) {
            stream << " and has coordinates ["
                   << ref_el.NodeCoords().col(sub_ent)[0] << " "
                   << ref_el.NodeCoords().col(sub_ent)[1] << "]" << '\n';
          }
          stream << '\n';
        }
      }
    }
  }
}